

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  CURLcode CVar1;
  size_t sVar2;
  undefined1 *__ptr;
  char **local_260;
  char *t;
  char text [512];
  CURLcode res;
  char *glob_buffer;
  unsigned_long amount;
  URLGlob *glob_expand;
  FILE *error_local;
  unsigned_long *urlnum_local;
  char *url_local;
  URLGlob **glob_local;
  
  glob_buffer = (char *)0x0;
  *glob = (URLGlob *)0x0;
  glob_expand = (URLGlob *)error;
  error_local = (FILE *)urlnum;
  urlnum_local = (unsigned_long *)url;
  url_local = (char *)glob;
  sVar2 = strlen(url);
  __ptr = (undefined1 *)malloc(sVar2 + 1);
  if (__ptr == (undefined1 *)0x0) {
    glob_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *__ptr = 0;
    amount = (unsigned_long)calloc(1,0x12f0);
    if ((void *)amount == (void *)0x0) {
      free(__ptr);
      glob_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      sVar2 = strlen((char *)urlnum_local);
      *(size_t *)(amount + 0x12c8) = sVar2;
      *(undefined1 **)(amount + 0x12d0) = __ptr;
      CVar1 = glob_parse((URLGlob *)amount,(char *)urlnum_local,1,(unsigned_long *)&glob_buffer);
      if (CVar1 == CURLE_OK) {
        *(char **)error_local = glob_buffer;
        *(unsigned_long *)url_local = amount;
        glob_local._4_4_ = CURLE_OK;
      }
      else {
        if ((glob_expand != (URLGlob *)0x0) && (*(long *)(amount + 0x12e0) != 0)) {
          if (*(long *)(amount + 0x12e8) == 0) {
            local_260 = *(char ***)(amount + 0x12e0);
          }
          else {
            curl_msnprintf(&t,0x200,"%s in URL position %zu:\n%s\n%*s^",
                           *(undefined8 *)(amount + 0x12e0),*(undefined8 *)(amount + 0x12e8),
                           urlnum_local,*(long *)(amount + 0x12e8) + -1," ");
            local_260 = &t;
          }
          curl_mfprintf(glob_expand,"curl: (%d) %s\n",CVar1,local_260);
        }
        glob_cleanup((URLGlob *)amount);
        *(undefined8 *)error_local = 1;
        glob_local._4_4_ = CVar1;
      }
    }
  }
  return glob_local._4_4_;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}